

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O0

VmConstant * LoadFrameStruct(InstructionVMEvalContext *ctx,Storage *storage,uint offset,VmType type)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  VmConstant *result;
  char *value;
  uint size;
  uint offset_local;
  Storage *storage_local;
  InstructionVMEvalContext *ctx_local;
  VmType type_local;
  char *__s;
  
  ctx_local._4_4_ = type.size;
  iVar2 = (*ctx->allocator->_vptr_Allocator[2])();
  __s = (char *)CONCAT44(extraout_var,iVar2);
  memset(__s,0,(ulong)ctx_local._4_4_);
  bVar1 = InstructionVMEvalContext::Storage::Reserve(storage,ctx,offset,ctx_local._4_4_);
  if (bVar1) {
    memcpy(__s,(storage->data).data + offset,(ulong)ctx_local._4_4_);
    type_local.structType = (TypeBase *)InstructionVMEvalContext::get<VmConstant>(ctx);
    VmConstant::VmConstant((VmConstant *)type_local.structType,ctx->allocator,type,(SynBase *)0x0);
    ((VmConstant *)type_local.structType)->sValue = __s;
  }
  else {
    type_local.structType =
         (TypeBase *)anon_unknown.dwarf_1b3692::Report(ctx,"ERROR: out of stack space");
  }
  return (VmConstant *)type_local.structType;
}

Assistant:

VmConstant* LoadFrameStruct(InstructionVMEvalContext &ctx, InstructionVMEvalContext::Storage *storage, unsigned offset, VmType type)
{
	unsigned size = type.size;

	char *value = (char*)ctx.allocator->alloc(size);
	memset(value, 0, size);

	if(!storage->Reserve(ctx, offset, size))
		return (VmConstant*)Report(ctx, "ERROR: out of stack space");

	memcpy(value, storage->data.data + offset, size);

	VmConstant *result = new (ctx.get<VmConstant>()) VmConstant(ctx.allocator, type, NULL);

	result->sValue = value;

	return result;
}